

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::ConfigureString
          (cmMakefile *this,string *input,string *output,bool atOnly,bool escapeQuotes)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  char *pcVar4;
  cmListFileContext *pcVar5;
  cmListFileContext *currentTrace;
  long lineNumber;
  char *filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  char *local_1a8;
  char *def_1;
  string indentation_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string indentation;
  char *def;
  byte local_8d;
  bool haveNewline;
  allocator<char> local_79;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_68 [8];
  string line;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  const_iterator lineEnd;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator lineStart;
  bool escapeQuotes_local;
  bool atOnly_local;
  string *output_local;
  string *input_local;
  cmMakefile *this_local;
  
  lineStart._M_current._6_1_ = escapeQuotes;
  lineStart._M_current._7_1_ = atOnly;
  local_30._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    lineEnd._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_30,&lineEnd);
    if (!bVar1) break;
    local_40._M_current = local_30._M_current;
    while( true ) {
      line.field_2._8_8_ = std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=
                        (&local_40,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&line.field_2 + 8));
      bVar1 = false;
      if (bVar2) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_40);
        bVar1 = *pcVar3 != '\n';
      }
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_40);
    }
    local_70._M_current = local_30._M_current;
    local_78._M_current = local_40._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)local_68,local_70,local_78,&local_79);
    std::allocator<char>::~allocator(&local_79);
    def = (char *)std::__cxx11::string::end();
    local_8d = __gnu_cxx::operator!=
                         (&local_40,
                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&def);
    if ((bool)local_8d) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_40);
    }
    bVar1 = cmsys::RegularExpression::find(&this->cmDefineRegex,(string *)local_68);
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_
                ((string *)((long)&indentation.field_2 + 8),&this->cmDefineRegex,2);
      pcVar4 = GetDefinition(this,(string *)((long)&indentation.field_2 + 8));
      std::__cxx11::string::~string((string *)(indentation.field_2._M_local_buf + 8));
      bVar1 = cmSystemTools::IsOff(pcVar4);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)output,"/* #undef ");
        cmsys::RegularExpression::match_abi_cxx11_
                  ((string *)((long)&indentation_1.field_2 + 8),&this->cmDefineRegex,2);
        std::__cxx11::string::operator+=
                  ((string *)output,(string *)(indentation_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(indentation_1.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)output," */");
      }
      else {
        cmsys::RegularExpression::match_abi_cxx11_((string *)local_e0,&this->cmDefineRegex,1);
        std::operator+(&local_120,"#",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        std::operator+(&local_100,&local_120,"cmakedefine");
        std::operator+(&local_160,"#",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        std::operator+(&local_140,&local_160,"define");
        cmsys::SystemTools::ReplaceString((string *)local_68,&local_100,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::operator+=((string *)output,(string *)local_68);
        std::__cxx11::string::~string((string *)local_e0);
      }
    }
    else {
      bVar1 = cmsys::RegularExpression::find(&this->cmDefine01Regex,(string *)local_68);
      if (bVar1) {
        cmsys::RegularExpression::match_abi_cxx11_((string *)&def_1,&this->cmDefine01Regex,1);
        cmsys::RegularExpression::match_abi_cxx11_(&local_1c8,&this->cmDefine01Regex,2);
        pcVar4 = GetDefinition(this,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        local_1a8 = pcVar4;
        std::operator+(&local_208,"#",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&def_1);
        std::operator+(&local_1e8,&local_208,"cmakedefine01");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &filename,"#",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&def_1);
        std::operator+(&local_228,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &filename,"define");
        cmsys::SystemTools::ReplaceString((string *)local_68,&local_1e8,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::operator+=((string *)output,(string *)local_68);
        bVar1 = cmSystemTools::IsOff(local_1a8);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)output," 0");
        }
        else {
          std::__cxx11::string::operator+=((string *)output," 1");
        }
        std::__cxx11::string::~string((string *)&def_1);
      }
      else {
        std::__cxx11::string::operator+=((string *)output,(string *)local_68);
      }
    }
    if ((local_8d & 1) != 0) {
      std::__cxx11::string::operator+=((string *)output,"\n");
    }
    local_30._M_current = local_40._M_current;
    std::__cxx11::string::~string((string *)local_68);
  }
  lineNumber = 0;
  currentTrace = (cmListFileContext *)0xffffffffffffffff;
  bVar1 = cmListFileBacktrace::Empty(&this->Backtrace);
  if (!bVar1) {
    pcVar5 = cmListFileBacktrace::Top(&this->Backtrace);
    lineNumber = std::__cxx11::string::c_str();
    currentTrace = (cmListFileContext *)pcVar5->Line;
  }
  ExpandVariablesInString
            (this,output,(bool)(lineStart._M_current._6_1_ & 1),true,
             (bool)(lineStart._M_current._7_1_ & 1),(char *)lineNumber,(long)currentTrace,true,true)
  ;
  return;
}

Assistant:

void cmMakefile::ConfigureString(const std::string& input, std::string& output,
                                 bool atOnly, bool escapeQuotes) const
{
  // Split input to handle one line at a time.
  std::string::const_iterator lineStart = input.begin();
  while (lineStart != input.end()) {
    // Find the end of this line.
    std::string::const_iterator lineEnd = lineStart;
    while (lineEnd != input.end() && *lineEnd != '\n') {
      ++lineEnd;
    }

    // Copy the line.
    std::string line(lineStart, lineEnd);

    // Skip the newline character.
    bool haveNewline = (lineEnd != input.end());
    if (haveNewline) {
      ++lineEnd;
    }

    // Replace #cmakedefine instances.
    if (this->cmDefineRegex.find(line)) {
      const char* def = this->GetDefinition(this->cmDefineRegex.match(2));
      if (!cmSystemTools::IsOff(def)) {
        const std::string indentation = this->cmDefineRegex.match(1);
        cmSystemTools::ReplaceString(line, "#" + indentation + "cmakedefine",
                                     "#" + indentation + "define");
        output += line;
      } else {
        output += "/* #undef ";
        output += this->cmDefineRegex.match(2);
        output += " */";
      }
    } else if (this->cmDefine01Regex.find(line)) {
      const std::string indentation = this->cmDefine01Regex.match(1);
      const char* def = this->GetDefinition(this->cmDefine01Regex.match(2));
      cmSystemTools::ReplaceString(line, "#" + indentation + "cmakedefine01",
                                   "#" + indentation + "define");
      output += line;
      if (!cmSystemTools::IsOff(def)) {
        output += " 1";
      } else {
        output += " 0";
      }
    } else {
      output += line;
    }

    if (haveNewline) {
      output += "\n";
    }

    // Move to the next line.
    lineStart = lineEnd;
  }

  // Perform variable replacements.
  const char* filename = nullptr;
  long lineNumber = -1;
  if (!this->Backtrace.Empty()) {
    const auto& currentTrace = this->Backtrace.Top();
    filename = currentTrace.FilePath.c_str();
    lineNumber = currentTrace.Line;
  }
  this->ExpandVariablesInString(output, escapeQuotes, true, atOnly, filename,
                                lineNumber, true, true);
}